

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void line_float(t_line_conflict *x,t_float f)

{
  double dVar1;
  double dVar2;
  double local_30;
  double timenow;
  t_float f_local;
  t_line_conflict *x_local;
  
  dVar1 = clock_getsystime();
  if ((x->x_gotinlet == 0) || (x->x_in1val <= 0.0)) {
    clock_unset(x->x_clock);
    x->x_setval = f;
    x->x_targetval = f;
    outlet_float((x->x_obj).te_outlet,f);
  }
  else {
    if (dVar1 < x->x_targettime || dVar1 == x->x_targettime) {
      x->x_setval = (float)(x->x_1overtimediff * (dVar1 - x->x_prevtime) *
                            (double)(x->x_targetval - x->x_setval) + (double)x->x_setval);
    }
    else {
      x->x_setval = x->x_targetval;
    }
    x->x_prevtime = dVar1;
    dVar2 = clock_getsystimeafter(x->x_in1val);
    x->x_targettime = dVar2;
    x->x_targetval = f;
    line_tick(x);
    x->x_gotinlet = 0;
    x->x_1overtimediff = 1.0 / (x->x_targettime - dVar1);
    if (x->x_grain <= 0.0) {
      x->x_grain = 20.0;
    }
    if ((double)x->x_grain < x->x_in1val || (double)x->x_grain == x->x_in1val) {
      local_30 = (double)x->x_grain;
    }
    else {
      local_30 = x->x_in1val;
    }
    clock_delay(x->x_clock,local_30);
  }
  x->x_gotinlet = 0;
  return;
}

Assistant:

static void line_float(t_line *x, t_float f)
{
    double timenow = clock_getsystime();
    if (x->x_gotinlet && x->x_in1val > 0)
    {
        if (timenow > x->x_targettime) x->x_setval = x->x_targetval;
        else x->x_setval = x->x_setval + x->x_1overtimediff *
            (timenow - x->x_prevtime)
            * (x->x_targetval - x->x_setval);
        x->x_prevtime = timenow;
        x->x_targettime = clock_getsystimeafter(x->x_in1val);
        x->x_targetval = f;
        line_tick(x);
        x->x_gotinlet = 0;
        x->x_1overtimediff = 1./ (x->x_targettime - timenow);
        if (x->x_grain <= 0)
            x->x_grain = DEFAULTLINEGRAIN;
        clock_delay(x->x_clock,
            (x->x_grain > x->x_in1val ? x->x_in1val : x->x_grain));

    }
    else
    {
        clock_unset(x->x_clock);
        x->x_targetval = x->x_setval = f;
        outlet_float(x->x_obj.ob_outlet, f);
    }
    x->x_gotinlet = 0;
}